

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall adios2::transport::FilePOSIX::SeekToEnd(FilePOSIX *this)

{
  int *piVar1;
  __off_t _Var2;
  long in_RDI;
  int status;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_118 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  FilePOSIX *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string local_b8 [16];
  FilePOSIX *in_stack_ffffffffffffff58;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  undefined1 local_31 [37];
  int local_c;
  
  WaitForOpen(in_stack_ffffffffffffff20);
  piVar1 = __errno_location();
  *piVar1 = 0;
  _Var2 = lseek(*(int *)(in_RDI + 0xf0),0,2);
  local_c = (int)_Var2;
  *(undefined4 *)(in_RDI + 0xf4) = 0;
  if (local_c == -1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_31 + 1),"Toolkit",(allocator *)__lhs);
    __rhs = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"transport::file::FilePOSIX",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"SeekToEnd",&local_91);
    std::operator+((char *)in_stack_ffffffffffffff18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::operator+(__lhs,(char *)__rhs);
    SysErrMsg_abi_cxx11_(in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff14);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string((string *)(local_31 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_31);
  }
  return;
}

Assistant:

void FilePOSIX::SeekToEnd()
{
    WaitForOpen();
    errno = 0;
    const int status = lseek(m_FileDescriptor, 0, SEEK_END);
    m_Errno = 0;
    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "SeekToEnd",
                                              "couldn't seek to the end of file " + m_Name + " " +
                                                  SysErrMsg());
    }
}